

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O3

int * inform_random_ints(int a,int b,size_t n)

{
  int iVar1;
  int *piVar2;
  size_t i;
  size_t sVar3;
  
  piVar2 = (int *)malloc(n * 4);
  if (n != 0 && piVar2 != (int *)0x0) {
    sVar3 = 0;
    do {
      iVar1 = rand();
      piVar2[sVar3] = iVar1 % (b - a) + a;
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
  }
  return piVar2;
}

Assistant:

int *inform_random_ints(int a, int b, size_t n)
{
    int *xs = malloc(n * sizeof(int));
    if (xs == NULL)
        return NULL;
    for (size_t i = 0; i < n; ++i)
        xs[i] = inform_random_int(a, b);
    return xs;
}